

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

void __thiscall
cmsys::SystemInformationImplementation::TrimNewline
          (SystemInformationImplementation *this,string *output)

{
  ulong uVar1;
  
  for (uVar1 = std::__cxx11::string::find((char *)output,0x522343,0); uVar1 != 0xffffffffffffffff;
      uVar1 = std::__cxx11::string::find((char *)output,0x522343,uVar1)) {
    if (output->_M_string_length < uVar1) goto LAB_003e4663;
    output->_M_string_length = uVar1;
    (output->_M_dataplus)._M_p[uVar1] = '\0';
  }
  uVar1 = std::__cxx11::string::find((char *)output,0x56c8c9,0);
  while( true ) {
    if (uVar1 == 0xffffffffffffffff) {
      return;
    }
    if (output->_M_string_length < uVar1) break;
    output->_M_string_length = uVar1;
    (output->_M_dataplus)._M_p[uVar1] = '\0';
    uVar1 = std::__cxx11::string::find((char *)output,0x56c8c9,uVar1);
  }
LAB_003e4663:
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",uVar1);
}

Assistant:

void SystemInformationImplementation::TrimNewline(std::string& output)
{
  // remove \r
  std::string::size_type pos = 0;
  while ((pos = output.find("\r", pos)) != std::string::npos) {
    output.erase(pos);
  }

  // remove \n
  pos = 0;
  while ((pos = output.find("\n", pos)) != std::string::npos) {
    output.erase(pos);
  }
}